

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValue
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,int index,
          TextGenerator *generator)

{
  string *psVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  LogMessage *pLVar5;
  FastFieldValuePrinter *pFVar6;
  Message *message_00;
  uint64 uVar7;
  int64 iVar8;
  string *this_00;
  EnumDescriptor *this_01;
  EnumValueDescriptor *pEVar9;
  undefined8 *puVar10;
  long lVar11;
  _func_void_FieldDescriptor_ptr *p_Var12;
  undefined4 uVar13;
  LogMessage local_118;
  FieldDescriptor *local_e0 [2];
  FieldDescriptor local_d0 [16];
  undefined1 local_c0 [24];
  _Alloc_hider _Stack_a8;
  undefined1 local_88 [8];
  string truncated_value;
  string scratch;
  
  if (index != -1 && *(int *)(field + 0x3c) != 3) {
    scratch.field_2._8_4_ = index;
    internal::LogMessage::LogMessage
              (&local_118,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/text_format.cc"
               ,0x910);
    pLVar5 = internal::LogMessage::operator<<
                       (&local_118,"CHECK failed: field->is_repeated() || (index == -1): ");
    pLVar5 = internal::LogMessage::operator<<(pLVar5,"Index must be -1 for non-repeated fields");
    internal::LogFinisher::operator=((LogFinisher *)local_c0,pLVar5);
    internal::LogMessage::~LogMessage(&local_118);
    index = scratch.field_2._8_4_;
  }
  pFVar6 = GetFieldPrinter(this,field);
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_c0._0_8_ = FieldDescriptor::TypeOnceInit;
    truncated_value.field_2._8_8_ = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_c0,
               (FieldDescriptor **)((long)&truncated_value.field_2 + 8));
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4)) {
  case 1:
    if (*(int *)(field + 0x3c) == 3) {
      uVar4 = Reflection::GetRepeatedInt32(reflection,message,field,index);
    }
    else {
      uVar4 = Reflection::GetInt32(reflection,message,field);
    }
    (*pFVar6->_vptr_FastFieldValuePrinter[3])(pFVar6,(ulong)uVar4,generator);
    break;
  case 2:
    if (*(int *)(field + 0x3c) == 3) {
      iVar8 = Reflection::GetRepeatedInt64(reflection,message,field,index);
    }
    else {
      iVar8 = Reflection::GetInt64(reflection,message,field);
    }
    (*pFVar6->_vptr_FastFieldValuePrinter[5])(pFVar6,iVar8,generator);
    break;
  case 3:
    if (*(int *)(field + 0x3c) == 3) {
      uVar4 = Reflection::GetRepeatedUInt32(reflection,message,field,index);
    }
    else {
      uVar4 = Reflection::GetUInt32(reflection,message,field);
    }
    (*pFVar6->_vptr_FastFieldValuePrinter[4])(pFVar6,(ulong)uVar4,generator);
    break;
  case 4:
    if (*(int *)(field + 0x3c) == 3) {
      uVar7 = Reflection::GetRepeatedUInt64(reflection,message,field,index);
    }
    else {
      uVar7 = Reflection::GetUInt64(reflection,message,field);
    }
    (*pFVar6->_vptr_FastFieldValuePrinter[6])(pFVar6,uVar7,generator);
    break;
  case 5:
    if (*(int *)(field + 0x3c) == 3) {
      dVar2 = Reflection::GetRepeatedDouble(reflection,message,field,index);
      uVar13 = SUB84(dVar2,0);
    }
    else {
      dVar2 = Reflection::GetDouble(reflection,message,field);
      uVar13 = SUB84(dVar2,0);
    }
    (*pFVar6->_vptr_FastFieldValuePrinter[8])(uVar13,pFVar6,generator);
    break;
  case 6:
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::GetRepeatedFloat(reflection,message,field,index);
    }
    else {
      Reflection::GetFloat(reflection,message,field);
    }
    (*pFVar6->_vptr_FastFieldValuePrinter[7])(pFVar6,generator);
    break;
  case 7:
    if (*(int *)(field + 0x3c) == 3) {
      bVar3 = Reflection::GetRepeatedBool(reflection,message,field,index);
    }
    else {
      bVar3 = Reflection::GetBool(reflection,message,field);
    }
    (*pFVar6->_vptr_FastFieldValuePrinter[2])(pFVar6,(ulong)bVar3,generator);
    break;
  case 8:
    if (*(int *)(field + 0x3c) == 3) {
      uVar4 = Reflection::GetRepeatedEnumValue(reflection,message,field,index);
    }
    else {
      uVar4 = Reflection::GetEnumValue(reflection,message,field);
    }
    this_01 = FieldDescriptor::enum_type(field);
    pEVar9 = EnumDescriptor::FindValueByNumber(this_01,uVar4);
    if (pEVar9 != (EnumValueDescriptor *)0x0) {
      (*pFVar6->_vptr_FastFieldValuePrinter[0xb])
                (pFVar6,(ulong)uVar4,*(undefined8 *)pEVar9,generator);
      return;
    }
    p_Var12 = (_func_void_FieldDescriptor_ptr *)(local_c0 + 0x10);
    local_c0._0_8_ = p_Var12;
    local_c0._8_8_ = FastInt32ToBufferLeft(uVar4,(char *)p_Var12);
    local_c0._8_8_ = local_c0._8_8_ + -(long)p_Var12;
    psVar1 = (string *)((long)&truncated_value.field_2 + 8);
    truncated_value.field_2._8_8_ = &scratch._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              (psVar1,local_c0._0_8_,(char *)(local_c0._8_8_ + local_c0._0_8_));
    (*pFVar6->_vptr_FastFieldValuePrinter[0xb])(pFVar6,(ulong)uVar4,psVar1,generator);
    if ((size_type *)truncated_value.field_2._8_8_ == &scratch._M_string_length) {
      return;
    }
    goto LAB_002f9551;
  case 9:
    truncated_value.field_2._8_8_ = &scratch._M_string_length;
    scratch._M_dataplus._M_p = (pointer)0x0;
    scratch._M_string_length._0_1_ = 0;
    if (*(int *)(field + 0x3c) == 3) {
      this_00 = Reflection::GetRepeatedStringReference
                          (reflection,message,field,index,
                           (string *)((long)&truncated_value.field_2 + 8));
    }
    else {
      this_00 = Reflection::GetStringReference
                          (reflection,message,field,(string *)((long)&truncated_value.field_2 + 8));
    }
    local_88 = (undefined1  [8])&truncated_value._M_string_length;
    truncated_value._M_dataplus._M_p = (pointer)0x0;
    truncated_value._M_string_length._0_1_ = 0;
    if ((0 < this->truncate_string_field_longer_than_) &&
       ((ulong)this->truncate_string_field_longer_than_ < this_00->_M_string_length)) {
      std::__cxx11::string::substr((ulong)local_e0,(ulong)this_00);
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)local_e0);
      p_Var12 = (_func_void_FieldDescriptor_ptr *)(puVar10 + 2);
      if ((_func_void_FieldDescriptor_ptr *)*puVar10 == p_Var12) {
        local_c0._16_8_ = *(undefined8 *)p_Var12;
        _Stack_a8._M_p = (pointer)puVar10[3];
        local_c0._0_8_ = local_c0 + 0x10;
      }
      else {
        local_c0._16_8_ = *(undefined8 *)p_Var12;
        local_c0._0_8_ = (_func_void_FieldDescriptor_ptr *)*puVar10;
      }
      local_c0._8_8_ = puVar10[1];
      *puVar10 = p_Var12;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      this_00 = (string *)local_88;
      std::__cxx11::string::operator=((string *)this_00,(string *)local_c0);
      if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
        operator_delete((void *)local_c0._0_8_);
      }
      if (local_e0[0] != local_d0) {
        operator_delete(local_e0[0]);
      }
    }
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_c0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_e0[0] = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_c0,local_e0)
      ;
    }
    lVar11 = 0x48;
    if (*(int *)(field + 0x38) != 9) {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_c0._0_8_ = FieldDescriptor::TypeOnceInit;
        local_e0[0] = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_c0,
                   local_e0);
      }
      if (*(int *)(field + 0x38) != 0xc) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_c0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/text_format.cc"
                   ,0x93a);
        pLVar5 = internal::LogMessage::operator<<
                           ((LogMessage *)local_c0,
                            "CHECK failed: (field->type()) == (FieldDescriptor::TYPE_BYTES): ");
        internal::LogFinisher::operator=((LogFinisher *)(scratch.field_2._M_local_buf + 0xf),pLVar5)
        ;
        internal::LogMessage::~LogMessage((LogMessage *)local_c0);
      }
      lVar11 = 0x50;
    }
    (**(code **)((long)pFVar6->_vptr_FastFieldValuePrinter + lVar11))(pFVar6,this_00,generator);
    if (local_88 != (undefined1  [8])&truncated_value._M_string_length) {
      operator_delete((void *)local_88);
    }
    if ((size_type *)truncated_value.field_2._8_8_ == &scratch._M_string_length) {
      return;
    }
LAB_002f9551:
    operator_delete((void *)truncated_value.field_2._8_8_);
    break;
  case 10:
    if (*(int *)(field + 0x3c) == 3) {
      message_00 = Reflection::GetRepeatedMessage(reflection,message,field,index);
    }
    else {
      message_00 = Reflection::GetMessage(reflection,message,field,(MessageFactory *)0x0);
    }
    Print(this,message_00,generator);
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldValue(const Message& message,
                                          const Reflection* reflection,
                                          const FieldDescriptor* field,
                                          int index,
                                          TextGenerator* generator) const {
  GOOGLE_DCHECK(field->is_repeated() || (index == -1))
      << "Index must be -1 for non-repeated fields";

  const FastFieldValuePrinter* printer = GetFieldPrinter(field);

  switch (field->cpp_type()) {
#define OUTPUT_FIELD(CPPTYPE, METHOD)                                \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                           \
    printer->Print##METHOD(                                          \
        field->is_repeated()                                         \
            ? reflection->GetRepeated##METHOD(message, field, index) \
            : reflection->Get##METHOD(message, field),               \
        generator);                                                  \
    break

    OUTPUT_FIELD(INT32, Int32);
    OUTPUT_FIELD(INT64, Int64);
    OUTPUT_FIELD(UINT32, UInt32);
    OUTPUT_FIELD(UINT64, UInt64);
    OUTPUT_FIELD(FLOAT, Float);
    OUTPUT_FIELD(DOUBLE, Double);
    OUTPUT_FIELD(BOOL, Bool);
#undef OUTPUT_FIELD

    case FieldDescriptor::CPPTYPE_STRING: {
      std::string scratch;
      const std::string& value =
          field->is_repeated()
              ? reflection->GetRepeatedStringReference(message, field, index,
                                                       &scratch)
              : reflection->GetStringReference(message, field, &scratch);
      const std::string* value_to_print = &value;
      std::string truncated_value;
      if (truncate_string_field_longer_than_ > 0 &&
          truncate_string_field_longer_than_ < value.size()) {
        truncated_value = value.substr(0, truncate_string_field_longer_than_) +
                          "...<truncated>...";
        value_to_print = &truncated_value;
      }
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        printer->PrintString(*value_to_print, generator);
      } else {
        GOOGLE_DCHECK_EQ(field->type(), FieldDescriptor::TYPE_BYTES);
        printer->PrintBytes(*value_to_print, generator);
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_ENUM: {
      int enum_value =
          field->is_repeated()
              ? reflection->GetRepeatedEnumValue(message, field, index)
              : reflection->GetEnumValue(message, field);
      const EnumValueDescriptor* enum_desc =
          field->enum_type()->FindValueByNumber(enum_value);
      if (enum_desc != nullptr) {
        printer->PrintEnum(enum_value, enum_desc->name(), generator);
      } else {
        // Ordinarily, enum_desc should not be null, because proto2 has the
        // invariant that set enum field values must be in-range, but with the
        // new integer-based API for enums (or the RepeatedField<int> loophole),
        // it is possible for the user to force an unknown integer value.  So we
        // simply use the integer value itself as the enum value name in this
        // case.
        printer->PrintEnum(enum_value, StrCat(enum_value), generator);
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_MESSAGE:
      Print(field->is_repeated()
                ? reflection->GetRepeatedMessage(message, field, index)
                : reflection->GetMessage(message, field),
            generator);
      break;
  }
}